

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v6::internal::
    parse_nonnegative_int<char,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>&,char>&>
              (char **begin,char *end,
              id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_&,_char>
              *eh)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = 0;
  pcVar1 = *begin;
  while (pcVar3 = pcVar1 + 1, uVar2 < 0xccccccd) {
    uVar2 = ((int)*pcVar1 + uVar2 * 10) - 0x30;
    *begin = pcVar3;
    if ((pcVar3 == end) || (pcVar1 = pcVar3, 9 < (byte)(*pcVar3 - 0x30U))) goto LAB_001351ae;
  }
  uVar2 = 0x80000000;
LAB_001351ae:
  if ((int)uVar2 < 0) {
    error_handler::on_error((error_handler *)eh->handler,"number is too big");
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}